

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qimage.cpp
# Opt level: O0

void __thiscall QImageData::~QImageData(QImageData *this)

{
  long in_RDI;
  qint64 unaff_retaddr;
  
  if (*(long *)(in_RDI + 0x78) != 0) {
    (**(code **)(in_RDI + 0x78))(*(undefined8 *)(in_RDI + 0x80));
  }
  if ((*(byte *)(in_RDI + 0x70) >> 3 & 1) != 0) {
    QImagePixmapCleanupHooks::executeImageHooks(unaff_retaddr);
  }
  if (*(long **)(in_RDI + 0x90) != (long *)0x0) {
    (**(code **)(**(long **)(in_RDI + 0x90) + 8))();
  }
  if ((*(long *)(in_RDI + 0x38) != 0) && ((*(byte *)(in_RDI + 0x70) & 1) != 0)) {
    QtPrivate::sizedFree(*(void **)(in_RDI + 0x38),*(ulong *)(in_RDI + 0x10));
  }
  *(undefined8 *)(in_RDI + 0x38) = 0;
  QColorSpace::~QColorSpace((QColorSpace *)0x2bb1a7);
  QMap<QString,_QString>::~QMap((QMap<QString,_QString> *)0x2bb1b8);
  QList<unsigned_int>::~QList((QList<unsigned_int> *)0x2bb1c6);
  return;
}

Assistant:

QImageData::~QImageData()
{
    if (cleanupFunction)
        cleanupFunction(cleanupInfo);
    if (is_cached)
        QImagePixmapCleanupHooks::executeImageHooks((((qint64) ser_no) << 32) | ((qint64) detach_no));
    delete paintEngine;
    if (data && own_data)
        QtPrivate::sizedFree(data, nbytes);
    data = nullptr;
}